

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

bool bsim::same_representation(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  quad_value other;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  quad_value bv;
  quad_value av;
  int i;
  quad_value local_1d;
  int local_1c;
  quad_value_bit_vector *local_18;
  quad_value_bit_vector *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = quad_value_bit_vector::bitLength(in_RDI);
  iVar3 = quad_value_bit_vector::bitLength(local_18);
  if (iVar2 == iVar3) {
    local_1c = 0;
    while (iVar3 = local_1c, iVar4 = quad_value_bit_vector::bitLength(local_10), iVar3 < iVar4) {
      local_1d = quad_value_bit_vector::get((quad_value_bit_vector *)CONCAT44(iVar2,iVar3),0);
      other = quad_value_bit_vector::get((quad_value_bit_vector *)CONCAT44(iVar2,iVar3),0);
      bVar1 = quad_value::same_representation(&local_1d,other);
      if (!bVar1) {
        return false;
      }
      local_1c = local_1c + 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool same_representation(const quad_value_bit_vector& a,
                           const quad_value_bit_vector& b) {
    if (a.bitLength() != b.bitLength()) {
      return false;
    }

    for (int i = 0; i < ((int) a.bitLength()); i++) {
      quad_value av = a.get(i);
      quad_value bv = b.get(i);
      if (!av.same_representation(bv)) {
        return false;
      }
    }
    return true;
  }